

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void * parse_all_variable(Parser *parser,Modifier *modifier)

{
  void *data;
  List *list;
  Stmt *pSVar1;
  
  data = parse_variable(parser,modifier);
  if (parser->token->kind == COMM) {
    list = new_list();
    while( true ) {
      list_add(list,data);
      if (parser->token->kind != COMM) break;
      bmove(parser);
      data = parse_variable(parser,modifier);
    }
    pSVar1 = new_stmt(list);
    return pSVar1;
  }
  return data;
}

Assistant:

void *parse_all_variable(Parser *parser, Modifier *modifier) {
    void *variable = parse_variable(parser, modifier);
    if (token(parser)->kind != COMM)
        return variable;
    List *stmt = new_list();
    list_add(stmt, variable);
    while (true) {
        if (token(parser)->kind == COMM) {
            bmove(parser);
        } else {
            break;
        }
        list_add(stmt, parse_variable(parser, modifier));
    }
    return new_stmt(stmt);
}